

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall
Model::Model(Model *this,string *filename,bool diffuse_texture,bool normal_map,bool specular_texture
            )

{
  pointer *ppvVar1;
  pointer *ppvVar2;
  TGAImage *this_00;
  double dVar3;
  iterator iVar4;
  iterator iVar5;
  iterator __position;
  pointer pcVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  istream *piVar10;
  long *plVar11;
  vec<3UL,_double> *__args;
  ostream *poVar12;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  Model *pMVar13;
  undefined3 in_register_00000081;
  size_t i;
  long lVar14;
  int n;
  char trash;
  int t;
  int f;
  string line;
  ifstream in;
  istringstream iss;
  undefined1 local_528 [8];
  TGAImage *local_520;
  int local_514;
  char local_50d;
  int local_50c;
  vec<3UL,_double> local_508;
  string *local_4e8;
  undefined4 local_4dc;
  undefined4 local_4d8;
  undefined4 local_4d4;
  char *local_4d0;
  undefined8 local_4c8;
  char local_4c0;
  undefined7 uStack_4bf;
  TGAImage *local_4b0;
  TGAImage *local_4a8;
  vector<vec<2ul,double>,std::allocator<vec<2ul,double>>> *local_4a0;
  vector<vec<3ul,double>,std::allocator<vec<3ul,double>>> *local_498;
  vector<int,std::allocator<int>> *local_490;
  vector<int,std::allocator<int>> *local_488;
  vector<int,std::allocator<int>> *local_480;
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  vec<2UL,_double> local_448;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  vec<2UL,_double> local_408;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  vec<2UL,_double> local_3c8;
  pointer local_3b8 [4];
  byte abStack_398 [488];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_4a0 = (vector<vec<2ul,double>,std::allocator<vec<2ul,double>>> *)&this->uv_;
  local_498 = (vector<vec<3ul,double>,std::allocator<vec<3ul,double>>> *)&this->norms_;
  local_480 = (vector<int,std::allocator<int>> *)&this->facet_vrt_;
  local_488 = (vector<int,std::allocator<int>> *)&this->facet_tex_;
  local_490 = (vector<int,std::allocator<int>> *)&this->facet_nrm_;
  local_4e8 = filename;
  memset(this,0,0x90);
  local_4a8 = &this->diffusemap_;
  TGAImage::TGAImage(&this->diffusemap_);
  local_4d4 = (undefined4)CONCAT71(in_register_00000011,diffuse_texture);
  local_4d8 = (undefined4)CONCAT71(in_register_00000009,normal_map);
  local_4b0 = &this->normalmap_;
  local_4dc = CONCAT31(in_register_00000081,specular_texture);
  TGAImage::TGAImage(local_4b0);
  this_00 = &this->specularmap_;
  TGAImage::TGAImage(this_00);
  std::ifstream::ifstream(local_3b8);
  std::ifstream::open((string *)local_3b8,(_Ios_Openmode)local_4e8);
  if ((abStack_398[(long)local_3b8[0][-1].x] & 5) == 0) {
    local_4d0 = &local_4c0;
    local_4c8 = 0;
    local_4c0 = '\0';
    dVar3 = local_3b8[0][-1].x;
    local_520 = this_00;
    if ((abStack_398[(long)dVar3] & 2) == 0) {
      do {
        cVar7 = std::ios::widen((char)local_528 + SUB81(dVar3,0) + 'p');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3b8,(string *)&local_4d0,cVar7);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_508,local_4d0,(allocator<char> *)&local_50c);
        std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_508,_S_in);
        if ((double *)local_508.x != &local_508.z) {
          operator_delete((void *)local_508.x,(long)local_508.z + 1);
        }
        iVar8 = std::__cxx11::string::compare((ulong)&local_4d0,0,(char *)0x2);
        if (iVar8 == 0) {
          std::operator>>((istream *)local_1b0,&local_50d);
          local_508.x = 0.0;
          local_508.y = 0.0;
          local_508.z = 0.0;
          lVar14 = 0;
          do {
            std::istream::_M_extract<double>((double *)local_1b0);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          iVar5._M_current =
               (this->verts_).
               super__Vector_base<vec<3UL,_double>,_std::allocator<vec<3UL,_double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->verts_).
              super__Vector_base<vec<3UL,_double>,_std::allocator<vec<3UL,_double>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<vec<3ul,double>,std::allocator<vec<3ul,double>>>::
            _M_realloc_insert<vec<3ul,double>const&>
                      ((vector<vec<3ul,double>,std::allocator<vec<3ul,double>>> *)this,iVar5,
                       &local_508);
          }
          else {
            (iVar5._M_current)->z = local_508.z;
            (iVar5._M_current)->x = local_508.x;
            (iVar5._M_current)->y = local_508.y;
            ppvVar1 = &(this->verts_).
                       super__Vector_base<vec<3UL,_double>,_std::allocator<vec<3UL,_double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppvVar1 = *ppvVar1 + 1;
          }
        }
        else {
          iVar8 = std::__cxx11::string::compare((ulong)&local_4d0,0,(char *)0x3);
          if (iVar8 == 0) {
            piVar10 = std::operator>>((istream *)local_1b0,&local_50d);
            std::operator>>(piVar10,&local_50d);
            local_508.x = 0.0;
            local_508.y = 0.0;
            local_508.z = 0.0;
            lVar14 = 0;
            do {
              std::istream::_M_extract<double>((double *)local_1b0);
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            __args = vec<3UL,_double>::normalize(&local_508);
            iVar5._M_current =
                 (this->norms_).
                 super__Vector_base<vec<3UL,_double>,_std::allocator<vec<3UL,_double>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->norms_).
                super__Vector_base<vec<3UL,_double>,_std::allocator<vec<3UL,_double>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<vec<3ul,double>,std::allocator<vec<3ul,double>>>::
              _M_realloc_insert<vec<3ul,double>const&>(local_498,iVar5,__args);
            }
            else {
              (iVar5._M_current)->z = __args->z;
              dVar3 = __args->y;
              (iVar5._M_current)->x = __args->x;
              (iVar5._M_current)->y = dVar3;
              ppvVar1 = &(this->norms_).
                         super__Vector_base<vec<3UL,_double>,_std::allocator<vec<3UL,_double>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppvVar1 = *ppvVar1 + 1;
            }
          }
          else {
            iVar8 = std::__cxx11::string::compare((ulong)&local_4d0,0,(char *)0x3);
            if (iVar8 == 0) {
              piVar10 = std::operator>>((istream *)local_1b0,&local_50d);
              std::operator>>(piVar10,&local_50d);
              local_508.x = 0.0;
              local_508.y = 0.0;
              lVar14 = 1;
              do {
                std::istream::_M_extract<double>((double *)local_1b0);
                lVar14 = lVar14 + -1;
              } while (lVar14 == 0);
              __position._M_current =
                   (this->uv_).
                   super__Vector_base<vec<2UL,_double>,_std::allocator<vec<2UL,_double>_>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->uv_).
                  super__Vector_base<vec<2UL,_double>,_std::allocator<vec<2UL,_double>_>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<vec<2ul,double>,std::allocator<vec<2ul,double>>>::
                _M_realloc_insert<vec<2ul,double>const&>
                          (local_4a0,__position,(vec<2UL,_double> *)&local_508);
              }
              else {
                (__position._M_current)->x = local_508.x;
                (__position._M_current)->y = local_508.y;
                ppvVar2 = &(this->uv_).
                           super__Vector_base<vec<2UL,_double>,_std::allocator<vec<2UL,_double>_>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppvVar2 = *ppvVar2 + 1;
              }
            }
            else {
              iVar8 = std::__cxx11::string::compare((ulong)&local_4d0,0,(char *)0x2);
              if (iVar8 == 0) {
                std::operator>>((istream *)local_1b0,&local_50d);
                iVar8 = 3;
                while( true ) {
                  piVar10 = (istream *)
                            std::istream::operator>>((istream *)local_1b0,(int *)&local_508);
                  piVar10 = std::operator>>(piVar10,&local_50d);
                  piVar10 = (istream *)std::istream::operator>>(piVar10,&local_50c);
                  piVar10 = std::operator>>(piVar10,&local_50d);
                  plVar11 = (long *)std::istream::operator>>(piVar10,&local_514);
                  if ((*(byte *)((long)plVar11 + *(long *)(*plVar11 + -0x18) + 0x20) & 5) != 0)
                  break;
                  iVar9 = local_508.x._0_4_ + -1;
                  local_508.x = (double)CONCAT44(local_508.x._4_4_,iVar9);
                  iVar4._M_current =
                       (this->facet_vrt_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar4._M_current ==
                      (this->facet_vrt_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              (local_480,iVar4,(int *)&local_508);
                  }
                  else {
                    *iVar4._M_current = iVar9;
                    (this->facet_vrt_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
                  }
                  local_50c = local_50c + -1;
                  iVar4._M_current =
                       (this->facet_tex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar4._M_current ==
                      (this->facet_tex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              (local_488,iVar4,&local_50c);
                  }
                  else {
                    *iVar4._M_current = local_50c;
                    (this->facet_tex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
                  }
                  local_514 = local_514 + -1;
                  iVar4._M_current =
                       (this->facet_nrm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar4._M_current ==
                      (this->facet_nrm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              (local_490,iVar4,&local_514);
                  }
                  else {
                    *iVar4._M_current = local_514;
                    (this->facet_nrm_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
                  }
                  iVar8 = iVar8 + -1;
                }
                if (iVar8 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             "Error: the obj file is supposed to be triangulated",0x32);
                  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
                  std::ostream::put(-0x68);
                  std::ostream::flush();
                  std::ifstream::close();
                  std::__cxx11::istringstream::~istringstream(local_1b0);
                  std::ios_base::~ios_base(local_138);
                  goto LAB_001042d7;
                }
              }
            }
          }
        }
        std::__cxx11::istringstream::~istringstream(local_1b0);
        std::ios_base::~ios_base(local_138);
        dVar3 = local_3b8[0][-1].x;
      } while ((abStack_398[(long)dVar3] & 2) == 0);
    }
    std::ifstream::close();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"# v# ",5);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," f# ",4);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," vt# ",5);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," vn# ",5);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    if ((char)local_4d4 != '\0') {
      pcVar6 = (local_4e8->_M_dataplus)._M_p;
      local_3d8._0_8_ = (pointer)(local_3d8 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_3e8 + 0x10),pcVar6,pcVar6 + local_4e8->_M_string_length);
      pMVar13 = (Model *)local_3f8;
      local_3f8._0_8_ = (pointer)local_3e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)pMVar13,"_diffuse.tga","");
      load_texture(pMVar13,(string *)(local_3e8 + 0x10),(string *)local_3f8,local_4a8);
      if ((pointer)local_3f8._0_8_ != (pointer)local_3e8) {
        operator_delete((void *)local_3f8._0_8_,(ulong)(local_3e8._0_8_ + 1));
      }
      if ((pointer)local_3d8._0_8_ != (pointer)(local_3d8 + 0x10)) {
        operator_delete((void *)local_3d8._0_8_,(ulong)((long)(double *)local_3c8.x + 1));
      }
    }
    if ((char)local_4d8 != '\0') {
      pcVar6 = (local_4e8->_M_dataplus)._M_p;
      local_418._0_8_ = (pointer)(local_418 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_428 + 0x10),pcVar6,pcVar6 + local_4e8->_M_string_length);
      pMVar13 = (Model *)local_438;
      local_438._0_8_ = (pointer)local_428;
      std::__cxx11::string::_M_construct<char_const*>((string *)pMVar13,"_nm_tangent.tga","");
      load_texture(pMVar13,(string *)(local_428 + 0x10),(string *)local_438,local_4b0);
      if ((pointer)local_438._0_8_ != (pointer)local_428) {
        operator_delete((void *)local_438._0_8_,(ulong)(local_428._0_8_ + 1));
      }
      if ((pointer)local_418._0_8_ != (pointer)(local_418 + 0x10)) {
        operator_delete((void *)local_418._0_8_,(ulong)((long)(double *)local_408.x + 1));
      }
    }
    if ((char)local_4dc != '\0') {
      pcVar6 = (local_4e8->_M_dataplus)._M_p;
      local_458._0_8_ = (pointer)(local_458 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_468 + 0x10),pcVar6,pcVar6 + local_4e8->_M_string_length);
      pMVar13 = (Model *)local_478;
      local_478._0_8_ = (pointer)local_468;
      std::__cxx11::string::_M_construct<char_const*>((string *)pMVar13,"_spec.tga","");
      load_texture(pMVar13,(string *)(local_468 + 0x10),(string *)local_478,local_520);
      if ((pointer)local_478._0_8_ != (pointer)local_468) {
        operator_delete((void *)local_478._0_8_,(ulong)(local_468._0_8_ + 1));
      }
      if ((pointer)local_458._0_8_ != (pointer)(local_458 + 0x10)) {
        operator_delete((void *)local_458._0_8_,(ulong)((long)(double *)local_448.x + 1));
      }
    }
LAB_001042d7:
    if (local_4d0 != &local_4c0) {
      operator_delete(local_4d0,CONCAT71(uStack_4bf,local_4c0) + 1);
    }
  }
  std::ifstream::~ifstream(local_3b8);
  return;
}

Assistant:

Model::Model(const std::string filename, bool diffuse_texture, bool normal_map,
             bool specular_texture)
{
    std::ifstream in;
    in.open(filename, std::ifstream::in);
    if (in.fail()) return;
    std::string line;
    while (!in.eof()) {
        std::getline(in, line);
        std::istringstream iss(line.c_str());
        char trash;
        if (!line.compare(0, 2, "v ")) {
            iss >> trash;
            vec3f v;
            for (size_t i = 0; i < 3; i++) iss >> v[i];
            verts_.push_back(v);
        } else if (!line.compare(0, 3, "vn ")) {
            iss >> trash >> trash;
            vec3f n;
            for (size_t i = 0; i < 3; i++) iss >> n[i];
            norms_.push_back(n.normalize());
        } else if (!line.compare(0, 3, "vt ")) {
            iss >> trash >> trash;
            vec2f uv;
            for (size_t i = 0; i < 2; i++) iss >> uv[i];
            uv_.push_back(uv);
        } else if (!line.compare(0, 2, "f ")) {
            int f, t, n;
            iss >> trash;
            int cnt = 0;
            while (iss >> f >> trash >> t >> trash >> n) {
                facet_vrt_.push_back(--f);
                facet_tex_.push_back(--t);
                facet_nrm_.push_back(--n);
                cnt++;
            }
            if (3 != cnt) {
                std::cerr << "Error: the obj file is supposed to be triangulated" << std::endl;
                in.close();
                return;
            }
        }
    }
    in.close();
    std::cerr << "# v# " << nverts() << " f# " << nfaces() << " vt# " << uv_.size() << " vn# "
              << norms_.size() << std::endl;
    if (diffuse_texture) load_texture(filename, "_diffuse.tga", diffusemap_);
    if (normal_map) load_texture(filename, "_nm_tangent.tga", normalmap_);
    if (specular_texture) load_texture(filename, "_spec.tga", specularmap_);
}